

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_setoneret(FuncState *fs,expdesc *e)

{
  if (e->k == VVARARG) {
    *(undefined1 *)((long)fs->f->code + (long)(e->u).info * 4 + 3) = 2;
    e->k = VRELOC;
  }
  else if (e->k == VCALL) {
    e->k = VNONRELOC;
    (e->u).info = fs->f->code[(e->u).info] >> 7 & 0xff;
    return;
  }
  return;
}

Assistant:

void luaK_setoneret (FuncState *fs, expdesc *e) {
  if (e->k == VCALL) {  /* expression is an open function call? */
    /* already returns 1 value */
    lua_assert(GETARG_C(getinstruction(fs, e)) == 2);
    e->k = VNONRELOC;  /* result has fixed position */
    e->u.info = GETARG_A(getinstruction(fs, e));
  }
  else if (e->k == VVARARG) {
    SETARG_C(getinstruction(fs, e), 2);
    e->k = VRELOC;  /* can relocate its simple result */
  }
}